

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_qcc_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  opj_bool oVar1;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 l_comp_no;
  OPJ_UINT32 l_num_comp;
  undefined4 in_stack_00000018;
  OPJ_UINT32 local_30;
  uint local_2c;
  opj_event_mgr_t *local_28;
  uint local_1c;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  local_2c = *(uint *)(*(long *)(in_RDI + 0x60) + 0x10);
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  if (local_2c < 0x101) {
    if (in_EDX == 0) {
      opj_event_msg_v2(in_RCX,1,"Error reading QCC marker\n");
      return 0;
    }
    opj_read_bytes_LE(in_RSI,&local_30,1);
    local_18 = local_18 + 1;
    local_1c = local_1c - 1;
  }
  else {
    if (in_EDX < 2) {
      opj_event_msg_v2(in_RCX,1,"Error reading QCC marker\n");
      return 0;
    }
    opj_read_bytes_LE(in_RSI,&local_30,2);
    local_18 = local_18 + 2;
    local_1c = local_1c - 2;
  }
  oVar1 = j2k_read_SQcd_SQcc(p_j2k,p_header_data._4_4_,
                             (OPJ_BYTE *)CONCAT44(p_header_size,in_stack_00000018),
                             (OPJ_UINT32 *)p_manager,_l_comp_no);
  if (oVar1 == 0) {
    opj_event_msg_v2(local_28,1,"Error reading QCC marker\n");
    local_4 = 0;
  }
  else if (local_1c == 0) {
    local_4 = 1;
  }
  else {
    opj_event_msg_v2(local_28,1,"Error reading QCC marker\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_qcc_v2(	opj_j2k_v2_t *p_j2k,
							OPJ_BYTE * p_header_data,
							OPJ_UINT32 p_header_size,
							struct opj_event_mgr * p_manager)
{
	OPJ_UINT32 l_num_comp,l_comp_no;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_num_comp = p_j2k->m_private_image->numcomps;

	if (l_num_comp <= 256) {
		if (p_header_size < 1) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
			return OPJ_FALSE;
		}
		opj_read_bytes(p_header_data,&l_comp_no,1);
		++p_header_data;
		--p_header_size;
	}
	else {
		if (p_header_size < 2) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
			return OPJ_FALSE;
		}
		opj_read_bytes(p_header_data,&l_comp_no,2);
		p_header_data+=2;
		p_header_size-=2;
	}

#ifdef USE_JPWL
	if (p_j2k->m_cp.correct) {

		static OPJ_UINT32 backup_compno = 0;

		/* compno is negative or larger than the number of components!!! */
		if ((l_comp_no < 0) || (l_comp_no >= l_num_comp)) {
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"JPWL: bad component number in QCC (%d out of a maximum of %d)\n",
				l_comp_no, l_num_comp);
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
			/* we try to correct */
			l_comp_no = backup_compno % l_num_comp;
			opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust this\n"
				"- setting component number to %d\n",
				l_comp_no);
		}

		/* keep your private count of tiles */
		backup_compno++;
	};
#endif /* USE_JPWL */

	if (! j2k_read_SQcd_SQcc(p_j2k,l_comp_no,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
		return OPJ_FALSE;
	}

	return OPJ_TRUE;
}